

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

int tcmalloc::SymbolizePrinter::pcinfo_success
              (void *data,uintptr_t pc,char *filename,int lineno,char *function)

{
  if (function == (char *)0x0) {
    *(undefined1 *)((long)data + 0x20) = 1;
  }
  else {
    DemangleAndPrint((SymbolizePrinter *)data,pc,filename,lineno,function,0);
  }
  return (uint)(function == (char *)0x0);
}

Assistant:

static int pcinfo_success(void* data, uintptr_t pc, const char* filename, int lineno, const char* function) {
    auto printer = static_cast<SymbolizePrinter*>(data);
    if (function == nullptr) {
      printer->want_syminfo_ = true;
      return 1;
    }

    printer->DemangleAndPrint(pc, filename, lineno, function, 0);

    return 0;
  }